

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O1

el_action_t vi_history_word(EditLine *el,wint_t c)

{
  el_action_t eVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  
  if ((el->el_flags & L'@') == L'\0') {
    pwVar4 = (wchar_t *)0x0;
    wVar2 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x03',0);
    if (wVar2 != L'\xffffffff') {
      pwVar4 = (el->el_history).ev.str;
    }
  }
  else {
    pwVar4 = hist_convert(el,L'\x03',(void *)0x0);
  }
  eVar1 = '\x06';
  if (pwVar4 != (wchar_t *)0x0) {
    pwVar6 = (wchar_t *)0x0;
    pwVar5 = (wchar_t *)0x0;
    while( true ) {
      pwVar7 = pwVar4 + -1;
      do {
        pwVar8 = pwVar4;
        pwVar4 = pwVar7 + 1;
        pwVar7 = pwVar7 + 1;
        iVar3 = iswspace(*pwVar4);
        pwVar4 = pwVar8 + 1;
      } while (iVar3 != 0);
      pwVar4 = pwVar5;
      if (*pwVar7 == L'\0') break;
      wVar2 = *pwVar7;
      pwVar4 = pwVar7;
      while ((wVar2 != L'\0' && (iVar3 = iswspace(wVar2), iVar3 == 0))) {
        wVar2 = pwVar4[1];
        pwVar4 = pwVar4 + 1;
      }
      if ((((el->el_state).doingarg != L'\0') &&
          (wVar2 = (el->el_state).argument, (el->el_state).argument = wVar2 + L'\xffffffff',
          pwVar6 = pwVar8, wVar2 < L'\x02')) || (pwVar6 = pwVar7, pwVar5 = pwVar4, *pwVar4 == L'\0')
         ) break;
    }
    if (pwVar6 == (wchar_t *)0x0) {
      eVar1 = '\x06';
    }
    else {
      eVar1 = '\x06';
      if (((el->el_state).doingarg == L'\0') || ((el->el_state).argument == L'\0')) {
        cv_undo(el);
        pwVar5 = (el->el_line).cursor;
        if (pwVar5 < (el->el_line).lastchar) {
          (el->el_line).cursor = pwVar5 + 1;
        }
        c_insert(el,(int)((ulong)((long)pwVar4 - (long)pwVar6) >> 2) + L'\x01');
        pwVar5 = (el->el_line).cursor;
        pwVar7 = (el->el_line).limit;
        if (pwVar5 < pwVar7) {
          *pwVar5 = L' ';
          pwVar5 = pwVar5 + 1;
        }
        if (pwVar5 < pwVar7 && pwVar6 < pwVar4) {
          do {
            *pwVar5 = *pwVar6;
            pwVar5 = pwVar5 + 1;
            if (pwVar4 <= pwVar6 + 1) break;
            pwVar6 = pwVar6 + 1;
          } while (pwVar5 < pwVar7);
        }
        (el->el_line).cursor = pwVar5;
        (el->el_map).current = (el->el_map).key;
        eVar1 = '\x04';
      }
    }
  }
  return eVar1;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_history_word(EditLine *el, wint_t c __attribute__((__unused__)))
{
	const wchar_t *wp = HIST_FIRST(el);
	const wchar_t *wep, *wsp;
	int len;
	wchar_t *cp;
	const wchar_t *lim;

	if (wp == NULL)
		return CC_ERROR;

	wep = wsp = NULL;
	do {
		while (iswspace(*wp))
			wp++;
		if (*wp == 0)
			break;
		wsp = wp;
		while (*wp && !iswspace(*wp))
			wp++;
		wep = wp;
	} while ((!el->el_state.doingarg || --el->el_state.argument > 0)
	    && *wp != 0);

	if (wsp == NULL || (el->el_state.doingarg && el->el_state.argument != 0))
		return CC_ERROR;

	cv_undo(el);
	len = (int)(wep - wsp);
	if (el->el_line.cursor < el->el_line.lastchar)
		el->el_line.cursor++;
	c_insert(el, len + 1);
	cp = el->el_line.cursor;
	lim = el->el_line.limit;
	if (cp < lim)
		*cp++ = ' ';
	while (wsp < wep && cp < lim)
		*cp++ = *wsp++;
	el->el_line.cursor = cp;

	el->el_map.current = el->el_map.key;
	return CC_REFRESH;
}